

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O0

void exchangeObjects(object *array1,object *array2,int size)

{
  int local_20;
  int x;
  int size_local;
  object *array2_local;
  object *array1_local;
  
  walk(memoryPointer,memoryTop,array1,array2,size);
  walk(staticPointer,staticTop,array1,array2,size);
  for (local_20 = 0; local_20 < rootTop; local_20 = local_20 + 1) {
    map(rootStack + local_20,array1,array2,size);
  }
  for (local_20 = 0; local_20 < staticRootTop; local_20 = local_20 + 1) {
    map(staticRoots[local_20],array1,array2,size);
  }
  return;
}

Assistant:

void exchangeObjects(struct object *array1, struct object *array2, int size)
{
    int x;

    /*
     * Convert our memory spaces
     */
    walk(memoryPointer, memoryTop, array1, array2, size);
    walk(staticPointer, staticTop, array1, array2, size);

    /*
     * Fix up the root pointers, too
     */
    for (x = 0; x < rootTop; x++) {
        map(&rootStack[x], array1, array2, size);
    }
    for (x = 0; x < staticRootTop; x++) {
        map(staticRoots[x], array1, array2, size);
    }
}